

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_byte_array_len_encode(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  cram_codec *pcVar1;
  uint uVar2;
  uint uVar3;
  int32_t i32;
  int local_2c;
  
  pcVar1 = (c->field_6).e_byte_array_len.len_codec;
  local_2c = in_size;
  uVar2 = (*pcVar1->encode)(slice,pcVar1,(char *)&local_2c,1);
  pcVar1 = (c->field_6).e_byte_array_len.val_codec;
  uVar3 = (*pcVar1->encode)(slice,pcVar1,in,in_size);
  return uVar3 | uVar2;
}

Assistant:

int cram_byte_array_len_encode(cram_slice *slice, cram_codec *c,
			       char *in, int in_size) {
    int32_t i32 = in_size;
    int r = 0;

    r |= c->e_byte_array_len.len_codec->encode(slice,
					       c->e_byte_array_len.len_codec,
					       (char *)&i32, 1);
    r |= c->e_byte_array_len.val_codec->encode(slice,
					       c->e_byte_array_len.val_codec,
					       in, in_size);
    return r;
}